

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

bool __thiscall ByteArray::toFile(ByteArray *this,path *fileName)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  undefined1 local_220 [8];
  ofstream stream;
  path *fileName_local;
  ByteArray *this_local;
  
  stream.super_basic_ofstream<char,_std::char_traits<char>_>._504_8_ = fileName;
  _Var2 = std::operator|(_S_out,_S_bin);
  _Var2 = std::operator|(_Var2,_S_trunc);
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)local_220,fileName,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::ostream::write(local_220,(long)this->data_);
    bVar1 = std::ios::fail();
    this_local._7_1_ = (bool)((bVar1 ^ 0xff) & 1);
  }
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)local_220);
  return this_local._7_1_;
}

Assistant:

bool ByteArray::toFile(const fs::path& fileName)
{
	fs::ofstream stream(fileName, fs::fstream::out | fs::fstream::binary | fs::fstream::trunc);
	if (!stream.is_open())
		return {};

	stream.write(reinterpret_cast<const char *>(data_), size_);
	return !stream.fail();
}